

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O1

void av1_set_rtc_reference_structure_one_layer(AV1_COMP *cpi,int gf_update)

{
  uint uVar1;
  AV1_PRIMARY *pAVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  uint *puVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  long lVar13;
  
  puVar6 = &(cpi->rc).frame_number_encoded;
  if ((cpi->oxcf).rc_cfg.drop_frames_water_mark == 0) {
    puVar6 = &(cpi->common).current_frame.frame_number;
  }
  pAVar2 = cpi->ppi;
  uVar1 = *puVar6;
  (cpi->ext_flags).ref_frame_flags = 0;
  (cpi->ext_flags).refresh_frame.last_frame = true;
  (cpi->ext_flags).refresh_frame.golden_frame = false;
  (cpi->ext_flags).refresh_frame.alt_ref_frame = false;
  auVar4 = _DAT_004d1660;
  (cpi->ext_flags).refresh_frame.update_pending = true;
  lVar10 = (long)(cpi->sf).rt_sf.sad_based_adp_altref_lag;
  uVar7 = 4;
  if (lVar10 != 0) {
    uVar3 = (cpi->rc).avg_source_sad;
    uVar7 = 3;
    if (uVar3 <= *(ulong *)(&DAT_005064a8 + lVar10 * 6)) {
      uVar7 = 4;
      if (uVar3 <= *(ulong *)(&DAT_005064b0 + lVar10 * 6)) {
        uVar7 = 6 - (*(ulong *)(&DAT_005064b8 + lVar10 * 6) < uVar3);
      }
    }
  }
  lVar10 = 0;
  auVar12 = _DAT_004d1640;
  auVar14 = _DAT_004d1650;
  do {
    auVar15 = auVar14 ^ auVar4;
    if (auVar15._4_4_ == -0x80000000 && auVar15._0_4_ < -0x7ffffff9) {
      (pAVar2->rtc_ref).ref_idx[lVar10] = 7;
      (pAVar2->rtc_ref).ref_idx[lVar10 + 1] = 7;
    }
    auVar15 = auVar12 ^ auVar4;
    if (auVar15._4_4_ == -0x80000000 && auVar15._0_4_ < -0x7ffffff9) {
      (pAVar2->rtc_ref).ref_idx[lVar10 + 2] = 7;
      (pAVar2->rtc_ref).ref_idx[lVar10 + 3] = 7;
    }
    lVar10 = lVar10 + 4;
    lVar13 = auVar14._8_8_;
    auVar14._0_8_ = auVar14._0_8_ + 4;
    auVar14._8_8_ = lVar13 + 4;
    lVar13 = auVar12._8_8_;
    auVar12._0_8_ = auVar12._0_8_ + 4;
    auVar12._8_8_ = lVar13 + 4;
  } while (lVar10 != 8);
  (pAVar2->rtc_ref).refresh[4] = 0;
  (pAVar2->rtc_ref).refresh[5] = 0;
  (pAVar2->rtc_ref).refresh[6] = 0;
  (pAVar2->rtc_ref).refresh[7] = 0;
  (pAVar2->rtc_ref).refresh[0] = 0;
  (pAVar2->rtc_ref).refresh[1] = 0;
  (pAVar2->rtc_ref).refresh[2] = 0;
  (pAVar2->rtc_ref).refresh[3] = 0;
  uVar9 = (cpi->ext_flags).ref_frame_flags;
  (cpi->ext_flags).ref_frame_flags = uVar9 ^ 1;
  if (((cpi->sf).rt_sf.force_only_last_ref == 0) &&
     ((cpi->ext_flags).ref_frame_flags = uVar9 ^ 0x49, (cpi->sf).rt_sf.ref_frame_comp_nonrd[1] != 0)
     ) {
    (cpi->ext_flags).ref_frame_flags = uVar9 ^ 0x4b;
  }
  uVar9 = 0;
  uVar11 = 0;
  if (1 < uVar1) {
    uVar11 = (uVar1 - 1) % 6;
  }
  if (uVar7 <= uVar1 && uVar1 - uVar7 != 0) {
    uVar9 = (uVar1 - uVar7) % 6;
  }
  uVar8 = uVar1 % 6;
  uVar7 = 0;
  if (((cpi->sf).rt_sf.ref_frame_comp_nonrd[1] != 0) && (uVar7 = 0, 2 < uVar1)) {
    uVar7 = (uVar1 - 2) % 6;
  }
  (pAVar2->rtc_ref).ref_idx[0] = uVar11;
  (pAVar2->rtc_ref).ref_idx[1] = uVar8;
  if ((cpi->sf).rt_sf.ref_frame_comp_nonrd[1] != 0) {
    (pAVar2->rtc_ref).ref_idx[1] = uVar7;
    (pAVar2->rtc_ref).ref_idx[2] = uVar8;
  }
  (pAVar2->rtc_ref).ref_idx[3] = 6;
  (pAVar2->rtc_ref).ref_idx[6] = uVar9;
  (pAVar2->rtc_ref).refresh[uVar8] = 1;
  if ((gf_update != 0) && ((cpi->common).current_frame.frame_type != '\0')) {
    (cpi->ext_flags).refresh_frame.golden_frame = true;
    (pAVar2->rtc_ref).refresh[6] = 1;
  }
  (pAVar2->rtc_ref).gld_idx_1layer = 6;
  cpi->rt_reduce_num_ref_buffers = 1;
  bVar5 = (pAVar2->rtc_ref).ref_idx[0] < 7;
  cpi->rt_reduce_num_ref_buffers = (uint)bVar5;
  bVar5 = bVar5 && (pAVar2->rtc_ref).ref_idx[1] < 7;
  cpi->rt_reduce_num_ref_buffers = (uint)bVar5;
  bVar5 = bVar5 && (pAVar2->rtc_ref).ref_idx[3] < 7;
  cpi->rt_reduce_num_ref_buffers = (uint)bVar5;
  bVar5 = bVar5 && (pAVar2->rtc_ref).ref_idx[6] < 7;
  cpi->rt_reduce_num_ref_buffers = (uint)bVar5;
  if ((cpi->sf).rt_sf.ref_frame_comp_nonrd[1] != 0) {
    cpi->rt_reduce_num_ref_buffers = (uint)(bVar5 && (pAVar2->rtc_ref).ref_idx[2] < 7);
  }
  return;
}

Assistant:

void av1_set_rtc_reference_structure_one_layer(AV1_COMP *cpi, int gf_update) {
  AV1_COMMON *const cm = &cpi->common;
  ExternalFlags *const ext_flags = &cpi->ext_flags;
  RATE_CONTROL *const rc = &cpi->rc;
  ExtRefreshFrameFlagsInfo *const ext_refresh_frame_flags =
      &ext_flags->refresh_frame;
  RTC_REF *const rtc_ref = &cpi->ppi->rtc_ref;
  unsigned int frame_number = (cpi->oxcf.rc_cfg.drop_frames_water_mark)
                                  ? rc->frame_number_encoded
                                  : cm->current_frame.frame_number;
  unsigned int lag_alt = 4;
  int last_idx = 0;
  int last_idx_refresh = 0;
  int gld_idx = 0;
  int alt_ref_idx = 0;
  int last2_idx = 0;
  ext_refresh_frame_flags->update_pending = 1;
  ext_flags->ref_frame_flags = 0;
  ext_refresh_frame_flags->last_frame = 1;
  ext_refresh_frame_flags->golden_frame = 0;
  ext_refresh_frame_flags->alt_ref_frame = 0;
  // Decide altref lag adaptively for rt
  if (cpi->sf.rt_sf.sad_based_adp_altref_lag) {
    lag_alt = 6;
    const uint64_t th_frame_sad[4][3] = {
      { 18000, 18000, 18000 },  // HDRES CPU 9
      { 25000, 25000, 25000 },  // MIDRES CPU 9
      { 40000, 30000, 20000 },  // HDRES CPU 10
      { 30000, 25000, 20000 }   // MIDRES CPU 10
    };
    int th_idx = cpi->sf.rt_sf.sad_based_adp_altref_lag - 1;
    assert(th_idx < 4);
    if (rc->avg_source_sad > th_frame_sad[th_idx][0])
      lag_alt = 3;
    else if (rc->avg_source_sad > th_frame_sad[th_idx][1])
      lag_alt = 4;
    else if (rc->avg_source_sad > th_frame_sad[th_idx][2])
      lag_alt = 5;
  }
  // This defines the reference structure for 1 layer (non-svc) RTC encoding.
  // To avoid the internal/default reference structure for non-realtime
  // overwriting this behavior, we use the "svc" ref parameters from the
  // external control SET_SVC_REF_FRAME_CONFIG.
  // TODO(marpan): rename that control and the related internal parameters
  // to rtc_ref.
  for (int i = 0; i < INTER_REFS_PER_FRAME; ++i) rtc_ref->ref_idx[i] = 7;
  for (int i = 0; i < REF_FRAMES; ++i) rtc_ref->refresh[i] = 0;
  // Set the reference frame flags.
  ext_flags->ref_frame_flags ^= AOM_LAST_FLAG;
  if (!cpi->sf.rt_sf.force_only_last_ref) {
    ext_flags->ref_frame_flags ^= AOM_ALT_FLAG;
    ext_flags->ref_frame_flags ^= AOM_GOLD_FLAG;
    if (cpi->sf.rt_sf.ref_frame_comp_nonrd[1])
      ext_flags->ref_frame_flags ^= AOM_LAST2_FLAG;
  }
  const int sh = 6;
  // Moving index slot for last: 0 - (sh - 1).
  if (frame_number > 1) last_idx = ((frame_number - 1) % sh);
  // Moving index for refresh of last: one ahead for next frame.
  last_idx_refresh = (frame_number % sh);
  gld_idx = 6;

  // Moving index for alt_ref, lag behind LAST by lag_alt frames.
  if (frame_number > lag_alt) alt_ref_idx = ((frame_number - lag_alt) % sh);
  if (cpi->sf.rt_sf.ref_frame_comp_nonrd[1]) {
    // Moving index for LAST2, lag behind LAST by 2 frames.
    if (frame_number > 2) last2_idx = ((frame_number - 2) % sh);
  }
  rtc_ref->ref_idx[0] = last_idx;          // LAST
  rtc_ref->ref_idx[1] = last_idx_refresh;  // LAST2 (for refresh of last).
  if (cpi->sf.rt_sf.ref_frame_comp_nonrd[1]) {
    rtc_ref->ref_idx[1] = last2_idx;         // LAST2
    rtc_ref->ref_idx[2] = last_idx_refresh;  // LAST3 (for refresh of last).
  }
  rtc_ref->ref_idx[3] = gld_idx;      // GOLDEN
  rtc_ref->ref_idx[6] = alt_ref_idx;  // ALT_REF
  // Refresh this slot, which will become LAST on next frame.
  rtc_ref->refresh[last_idx_refresh] = 1;
  // Update GOLDEN on period for fixed slot case.
  if (gf_update && cm->current_frame.frame_type != KEY_FRAME) {
    ext_refresh_frame_flags->golden_frame = 1;
    rtc_ref->refresh[gld_idx] = 1;
  }
  rtc_ref->gld_idx_1layer = gld_idx;
  // Set the flag to reduce the number of reference frame buffers used.
  // This assumes that slot 7 is never used.
  cpi->rt_reduce_num_ref_buffers = 1;
  cpi->rt_reduce_num_ref_buffers &= (rtc_ref->ref_idx[0] < 7);
  cpi->rt_reduce_num_ref_buffers &= (rtc_ref->ref_idx[1] < 7);
  cpi->rt_reduce_num_ref_buffers &= (rtc_ref->ref_idx[3] < 7);
  cpi->rt_reduce_num_ref_buffers &= (rtc_ref->ref_idx[6] < 7);
  if (cpi->sf.rt_sf.ref_frame_comp_nonrd[1])
    cpi->rt_reduce_num_ref_buffers &= (rtc_ref->ref_idx[2] < 7);
}